

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_nullParentOfVariable_Test::TestBody(Variable_nullParentOfVariable_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_68 [8];
  Message local_60 [24];
  shared_ptr<libcellml::ParentedEntity> local_48;
  undefined1 local_38 [16];
  AssertionResult gtest_ar;
  VariablePtr v;
  Variable_nullParentOfVariable_Test *this_local;
  
  libcellml::Variable::create();
  local_38._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ParentedEntity::parent();
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            (local_38 + 8,"nullptr",(void **)"v->parent()",
             (shared_ptr<libcellml::ParentedEntity> *)local_38,&local_48);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_38 + 8));
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_38 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_38 + 8));
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Variable, nullParentOfVariable)
{
    libcellml::VariablePtr v = libcellml::Variable::create();
    EXPECT_EQ(nullptr, v->parent());
}